

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O0

void __thiscall
pg::ZLKPPSolver::solve_liverpool
          (ZLKPPSolver *this,int max_priority,int prec_cur,int prec_opo,bool *reached_bottom_cur,
          bool *reached_bottom_opo)

{
  bool bVar1;
  int local_38;
  int local_34;
  int dummy;
  int initial_num_nodes;
  bool *reached_bottom_opo_local;
  bool *reached_bottom_cur_local;
  int local_18;
  int prec_opo_local;
  int prec_cur_local;
  int max_priority_local;
  ZLKPPSolver *this_local;
  
  local_34 = this->cur_num_nodes;
  _dummy = reached_bottom_opo;
  reached_bottom_opo_local = reached_bottom_cur;
  reached_bottom_cur_local._4_4_ = prec_opo;
  local_18 = prec_cur;
  prec_opo_local = max_priority;
  _prec_cur_local = this;
  if (this->min_dominion <= prec_opo / 2) {
    solve_liverpool(this,max_priority,prec_cur,prec_opo / 2,reached_bottom_cur,reached_bottom_opo);
  }
  if (((reached_bottom_cur_local._4_4_ / 2 < local_34) &&
      (bVar1 = do_step(this,prec_opo_local,local_18,reached_bottom_cur_local._4_4_,&local_38,
                       reached_bottom_opo_local,_dummy), bVar1)) &&
     (this->min_dominion <= reached_bottom_cur_local._4_4_ / 2)) {
    solve_liverpool(this,prec_opo_local,local_18,reached_bottom_cur_local._4_4_ / 2,
                    reached_bottom_opo_local,_dummy);
  }
  return;
}

Assistant:

void ZLKPPSolver::solve_liverpool(int max_priority, int prec_cur, int prec_opo, bool &reached_bottom_cur, bool &reached_bottom_opo) {
    int initial_num_nodes = cur_num_nodes, dummy;
    if (prec_opo / 2 >= min_dominion)
        solve_liverpool(max_priority, prec_cur, prec_opo / 2, reached_bottom_cur, reached_bottom_opo);
    if (initial_num_nodes <= prec_opo / 2)
        return;
    if (do_step(max_priority, prec_cur, prec_opo, dummy, reached_bottom_cur, reached_bottom_opo) && prec_opo / 2 >= min_dominion)
        solve_liverpool(max_priority, prec_cur, prec_opo / 2, reached_bottom_cur, reached_bottom_opo);
}